

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

void del_engr(level *lev,engr *ep)

{
  engr *peVar1;
  engr *peVar2;
  
  peVar1 = lev->lev_engr;
  if (lev->lev_engr == ep) {
    lev->lev_engr = ep->nxt_engr;
  }
  else {
    do {
      peVar2 = peVar1;
      if (peVar2 == (engr *)0x0) {
        warning("Error in del_engr?");
        goto LAB_0019890b;
      }
      peVar1 = peVar2->nxt_engr;
    } while (peVar2->nxt_engr != ep);
    peVar2->nxt_engr = ep->nxt_engr;
LAB_0019890b:
    if (peVar2 == (engr *)0x0) {
      return;
    }
  }
  free(ep);
  return;
}

Assistant:

void del_engr(struct level *lev, struct engr *ep)
{
	if (ep == lev->lev_engr) {
		lev->lev_engr = ep->nxt_engr;
	} else {
		struct engr *ept;

		for (ept = lev->lev_engr; ept; ept = ept->nxt_engr)
		    if (ept->nxt_engr == ep) {
			ept->nxt_engr = ep->nxt_engr;
			break;
		    }
		if (!ept) {
		    warning("Error in del_engr?");
		    return;
		}
	}
	dealloc_engr(ep);
}